

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_16777232,_true,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 *puVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 *puVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  undefined8 *puVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar26;
  Ref<embree::Geometry> *pRVar27;
  Geometry *pGVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  RTCIntersectArguments *pRVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined8 uVar41;
  undefined8 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint uVar45;
  AABBNodeMB4D *node1;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  undefined4 uVar50;
  ulong unaff_RBX;
  size_t mask;
  int iVar51;
  ulong uVar52;
  NodeRef *pNVar53;
  ulong uVar54;
  Scene *pSVar55;
  ulong uVar56;
  long lVar57;
  long lVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  size_t sVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  bool bVar69;
  float fVar70;
  float fVar71;
  float fVar81;
  float fVar82;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar95;
  float fVar97;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar96;
  float fVar98;
  float fVar99;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar100;
  float fVar106;
  float fVar107;
  undefined1 auVar101 [16];
  float fVar108;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar109;
  float fVar115;
  float fVar116;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar117;
  float fVar121;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar122;
  float fVar123;
  undefined1 auVar124 [12];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar133;
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar137;
  float fVar138;
  float fVar142;
  undefined1 auVar139 [16];
  float fVar143;
  float fVar144;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar145;
  float fVar146;
  float fVar150;
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar147 [16];
  float fVar152;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar166;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar174;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar175 [16];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  int local_c5c;
  float local_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  undefined4 uStack_c48;
  undefined4 uStack_c44;
  RayQueryContext *local_c40;
  undefined1 local_c38 [8];
  float fStack_c30;
  float fStack_c2c;
  undefined8 local_c28;
  float fStack_c20;
  float fStack_c1c;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  float local_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  undefined1 local_b78 [16];
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  Scene *local_b50;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa0;
  float fStack_a9c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [8];
  float fStack_920;
  float fStack_91c;
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined8 local_838;
  undefined8 uStack_830;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) ||
     (fVar70 = ray->tfar, fVar70 < 0.0)) {
    return;
  }
  pNVar53 = stack + 1;
  stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  aVar26 = (ray->dir).field_0.field_1;
  fVar82 = *(float *)((long)&(ray->org).field_0 + 0xc);
  fVar108 = 0.0;
  if (0.0 <= fVar82) {
    fVar108 = fVar82;
  }
  auVar86._4_4_ = -(uint)(ABS(aVar26.y) < 1e-18);
  auVar86._0_4_ = -(uint)(ABS(aVar26.x) < 1e-18);
  auVar86._8_4_ = -(uint)(ABS(aVar26.z) < 1e-18);
  auVar86._12_4_ = -(uint)(ABS(aVar26.field_3.w) < 1e-18);
  fVar82 = (ray->org).field_0.m128[0];
  fVar173 = (ray->org).field_0.m128[1];
  fVar179 = (ray->org).field_0.m128[2];
  auVar139 = divps(_DAT_01feca10,(undefined1  [16])aVar26);
  auVar139 = blendvps(auVar139,_DAT_0201c930,auVar86);
  fVar145 = auVar139._0_4_ * 0.99999964;
  fVar150 = auVar139._4_4_ * 0.99999964;
  fVar153 = auVar139._8_4_ * 0.99999964;
  fVar137 = auVar139._0_4_ * 1.0000004;
  local_c08 = auVar139._4_4_ * 1.0000004;
  fVar142 = auVar139._8_4_ * 1.0000004;
  uVar56 = (ulong)(fVar145 < 0.0) * 0x10;
  uVar59 = (ulong)(fVar150 < 0.0) << 4 | 0x20;
  uVar61 = (ulong)(fVar153 < 0.0) << 4 | 0x40;
  auVar139._4_4_ = fVar70;
  auVar139._0_4_ = fVar70;
  auVar139._8_4_ = fVar70;
  auVar139._12_4_ = fVar70;
  local_838 = mm_lookupmask_ps._0_8_;
  uStack_830 = mm_lookupmask_ps._8_8_;
  local_8d8 = mm_lookupmask_ps._240_16_;
  fVar70 = fVar108;
  fVar71 = fVar108;
  fVar81 = fVar108;
  fVar84 = fVar150;
  fVar85 = fVar150;
  fVar96 = fVar150;
  fVar97 = fVar137;
  fVar98 = fVar137;
  fVar99 = fVar137;
  fVar100 = fVar179;
  fVar106 = fVar179;
  fVar107 = fVar179;
  fVar109 = fVar153;
  fVar115 = fVar153;
  fVar116 = fVar153;
  fVar117 = fVar82;
  fVar121 = fVar82;
  fVar123 = fVar82;
  fVar130 = fVar173;
  fVar131 = fVar173;
  fVar132 = fVar173;
  fVar133 = fVar145;
  fVar134 = fVar145;
  fVar138 = fVar145;
  fStack_c04 = local_c08;
  fVar143 = local_c08;
  fVar144 = local_c08;
  local_c40 = context;
  fStack_c00 = local_c08;
  fStack_bfc = local_c08;
  local_bf8 = fVar137;
  fStack_bf4 = fVar137;
  fStack_bf0 = fVar137;
  fStack_bec = fVar137;
  local_be8 = fVar150;
  fStack_be4 = fVar150;
  fStack_be0 = fVar150;
  fStack_bdc = fVar150;
  local_bd8 = fVar145;
  fStack_bd4 = fVar145;
  fStack_bd0 = fVar145;
  fStack_bcc = fVar145;
  local_bc8 = fVar173;
  fStack_bc4 = fVar173;
  fStack_bc0 = fVar173;
  fStack_bbc = fVar173;
  local_bb8 = fVar82;
  fStack_bb4 = fVar82;
  fStack_bb0 = fVar82;
  fStack_bac = fVar82;
  local_ba8 = fVar153;
  fStack_ba4 = fVar153;
  fStack_ba0 = fVar153;
  fStack_b9c = fVar153;
  local_b98 = fVar179;
  fStack_b94 = fVar179;
  fStack_b90 = fVar179;
  fStack_b8c = fVar179;
  local_b88 = fVar108;
  fStack_b84 = fVar108;
  fStack_b80 = fVar108;
  fStack_b7c = fVar108;
  local_b78 = auVar139;
LAB_0022d5b5:
  if (pNVar53 == stack) {
    return;
  }
  sVar62 = pNVar53[-1].ptr;
  pNVar53 = pNVar53 + -1;
  do {
    if ((sVar62 & 8) == 0) {
      fVar152 = (ray->dir).field_0.m128[3];
      uVar46 = sVar62 & 0xfffffffffffffff0;
      pfVar23 = (float *)(uVar46 + 0x80 + uVar56);
      pfVar19 = (float *)(uVar46 + 0x20 + uVar56);
      auVar114._0_4_ = ((*pfVar23 * fVar152 + *pfVar19) - fVar82) * fVar145;
      auVar114._4_4_ = ((pfVar23[1] * fVar152 + pfVar19[1]) - fVar117) * fVar133;
      auVar114._8_4_ = ((pfVar23[2] * fVar152 + pfVar19[2]) - fVar121) * fVar134;
      auVar114._12_4_ = ((pfVar23[3] * fVar152 + pfVar19[3]) - fVar123) * fVar138;
      auVar111._4_4_ = fVar70;
      auVar111._0_4_ = fVar108;
      auVar111._8_4_ = fVar71;
      auVar111._12_4_ = fVar81;
      pfVar23 = (float *)(uVar46 + 0x80 + uVar59);
      pfVar19 = (float *)(uVar46 + 0x20 + uVar59);
      auVar86 = maxps(auVar111,auVar114);
      auVar110._0_4_ = ((*pfVar23 * fVar152 + *pfVar19) - fVar173) * fVar150;
      auVar110._4_4_ = ((pfVar23[1] * fVar152 + pfVar19[1]) - fVar130) * fVar84;
      auVar110._8_4_ = ((pfVar23[2] * fVar152 + pfVar19[2]) - fVar131) * fVar85;
      auVar110._12_4_ = ((pfVar23[3] * fVar152 + pfVar19[3]) - fVar132) * fVar96;
      pfVar23 = (float *)(uVar46 + 0x80 + uVar61);
      pfVar19 = (float *)(uVar46 + 0x20 + uVar61);
      auVar101._0_4_ = ((*pfVar23 * fVar152 + *pfVar19) - fVar179) * fVar153;
      auVar101._4_4_ = ((pfVar23[1] * fVar152 + pfVar19[1]) - fVar100) * fVar109;
      auVar101._8_4_ = ((pfVar23[2] * fVar152 + pfVar19[2]) - fVar106) * fVar115;
      auVar101._12_4_ = ((pfVar23[3] * fVar152 + pfVar19[3]) - fVar107) * fVar116;
      auVar111 = maxps(auVar110,auVar101);
      auVar86 = maxps(auVar86,auVar111);
      pfVar23 = (float *)(uVar46 + 0x80 + (uVar56 ^ 0x10));
      pfVar19 = (float *)(uVar46 + 0x20 + (uVar56 ^ 0x10));
      auVar112._0_4_ = ((*pfVar23 * fVar152 + *pfVar19) - fVar82) * fVar137;
      auVar112._4_4_ = ((pfVar23[1] * fVar152 + pfVar19[1]) - fVar117) * fVar97;
      auVar112._8_4_ = ((pfVar23[2] * fVar152 + pfVar19[2]) - fVar121) * fVar98;
      auVar112._12_4_ = ((pfVar23[3] * fVar152 + pfVar19[3]) - fVar123) * fVar99;
      auVar111 = minps(auVar139,auVar112);
      pfVar24 = (float *)(uVar46 + 0x80 + (uVar59 ^ 0x10));
      pfVar19 = (float *)(uVar46 + 0x20 + (uVar59 ^ 0x10));
      pfVar25 = (float *)(uVar46 + 0x80 + (uVar61 ^ 0x10));
      pfVar23 = (float *)(uVar46 + 0x20 + (uVar61 ^ 0x10));
      auVar113._0_4_ = ((*pfVar24 * fVar152 + *pfVar19) - fVar173) * local_c08;
      auVar113._4_4_ = ((pfVar24[1] * fVar152 + pfVar19[1]) - fVar130) * fStack_c04;
      auVar113._8_4_ = ((pfVar24[2] * fVar152 + pfVar19[2]) - fVar131) * fVar143;
      auVar113._12_4_ = ((pfVar24[3] * fVar152 + pfVar19[3]) - fVar132) * fVar144;
      auVar118._0_4_ = ((*pfVar25 * fVar152 + *pfVar23) - fVar179) * fVar142;
      auVar118._4_4_ = ((pfVar25[1] * fVar152 + pfVar23[1]) - fVar100) * fVar142;
      auVar118._8_4_ = ((pfVar25[2] * fVar152 + pfVar23[2]) - fVar106) * fVar142;
      auVar118._12_4_ = ((pfVar25[3] * fVar152 + pfVar23[3]) - fVar107) * fVar142;
      auVar114 = minps(auVar113,auVar118);
      auVar111 = minps(auVar111,auVar114);
      bVar69 = auVar86._0_4_ <= auVar111._0_4_;
      bVar35 = auVar86._4_4_ <= auVar111._4_4_;
      bVar36 = auVar86._8_4_ <= auVar111._8_4_;
      bVar37 = auVar86._12_4_ <= auVar111._12_4_;
      if (((uint)sVar62 & 7) == 6) {
        bVar69 = (fVar152 < *(float *)(uVar46 + 0xf0) && *(float *)(uVar46 + 0xe0) <= fVar152) &&
                 bVar69;
        bVar35 = (fVar152 < *(float *)(uVar46 + 0xf4) && *(float *)(uVar46 + 0xe4) <= fVar152) &&
                 bVar35;
        bVar36 = (fVar152 < *(float *)(uVar46 + 0xf8) && *(float *)(uVar46 + 0xe8) <= fVar152) &&
                 bVar36;
        bVar37 = (fVar152 < *(float *)(uVar46 + 0xfc) && *(float *)(uVar46 + 0xec) <= fVar152) &&
                 bVar37;
      }
      auVar87._0_4_ = (uint)bVar69 * -0x80000000;
      auVar87._4_4_ = (uint)bVar35 * -0x80000000;
      auVar87._8_4_ = (uint)bVar36 * -0x80000000;
      auVar87._12_4_ = (uint)bVar37 * -0x80000000;
      uVar50 = movmskps((int)unaff_RBX,auVar87);
      unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar50);
    }
    if ((sVar62 & 8) == 0) {
      if (unaff_RBX == 0) {
        iVar51 = 4;
      }
      else {
        uVar46 = sVar62 & 0xfffffffffffffff0;
        lVar57 = 0;
        if (unaff_RBX != 0) {
          for (; (unaff_RBX >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
          }
        }
        iVar51 = 0;
        sVar62 = *(size_t *)(uVar46 + lVar57 * 8);
        uVar52 = unaff_RBX - 1 & unaff_RBX;
        if (uVar52 != 0) {
          pNVar53->ptr = sVar62;
          lVar57 = 0;
          if (uVar52 != 0) {
            for (; (uVar52 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
            }
          }
          uVar63 = uVar52 - 1;
          while( true ) {
            pNVar53 = pNVar53 + 1;
            sVar62 = *(size_t *)(uVar46 + lVar57 * 8);
            uVar63 = uVar63 & uVar52;
            if (uVar63 == 0) break;
            pNVar53->ptr = sVar62;
            lVar57 = 0;
            if (uVar63 != 0) {
              for (; (uVar63 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
              }
            }
            uVar52 = uVar63 - 1;
          }
          iVar51 = 0;
        }
      }
    }
    else {
      iVar51 = 6;
    }
  } while (iVar51 == 0);
  if (iVar51 == 6) {
    uVar46 = (ulong)((uint)sVar62 & 0xf);
    iVar51 = 0;
    uVar52 = uVar46 - 8;
    bVar69 = uVar46 != 8;
    if (bVar69) {
      uVar63 = sVar62 & 0xfffffffffffffff0;
      uVar46 = 0;
      do {
        lVar57 = uVar46 * 0x60;
        pSVar55 = context->scene;
        pRVar27 = (pSVar55->geometries).items;
        pGVar28 = pRVar27[*(uint *)(uVar63 + 0x40 + lVar57)].ptr;
        fVar70 = (pGVar28->time_range).lower;
        local_848 = (((ray->dir).field_0.m128[3] - fVar70) / ((pGVar28->time_range).upper - fVar70))
                    * pGVar28->fnumTimeSegments;
        auVar88 = roundss(ZEXT416((uint)fVar70),ZEXT416((uint)local_848),9);
        fVar70 = pGVar28->fnumTimeSegments + -1.0;
        if (fVar70 <= auVar88._0_4_) {
          auVar88._0_4_ = fVar70;
        }
        fVar70 = 0.0;
        if (0.0 <= auVar88._0_4_) {
          fVar70 = auVar88._0_4_;
        }
        local_848 = local_848 - fVar70;
        lVar60 = (long)(int)fVar70 * 0x38;
        lVar29 = *(long *)(*(long *)&pGVar28[2].numPrimitives + lVar60);
        uVar48 = (ulong)*(uint *)(uVar63 + 4 + lVar57);
        pfVar19 = (float *)(lVar29 + (ulong)*(uint *)(uVar63 + lVar57) * 4);
        uVar49 = (ulong)*(uint *)(uVar63 + 0x10 + lVar57);
        pfVar23 = (float *)(lVar29 + uVar49 * 4);
        uVar66 = (ulong)*(uint *)(uVar63 + 0x30 + lVar57);
        pfVar24 = (float *)(lVar29 + uVar66 * 4);
        lVar58 = *(long *)&pRVar27[*(uint *)(uVar63 + 0x44 + lVar57)].ptr[2].numPrimitives;
        uVar65 = *(ulong *)(lVar58 + lVar60);
        pfVar25 = (float *)(uVar65 + uVar48 * 4);
        uVar64 = (ulong)*(uint *)(uVar63 + 0x14 + lVar57);
        pfVar1 = (float *)(uVar65 + uVar64 * 4);
        lVar47 = (long)((int)fVar70 + 1) * 0x38;
        lVar30 = *(long *)(*(long *)&pGVar28[2].numPrimitives + lVar47);
        pfVar2 = (float *)(lVar30 + (ulong)*(uint *)(uVar63 + lVar57) * 4);
        uVar54 = (ulong)*(uint *)(uVar63 + 0x34 + lVar57);
        pfVar3 = (float *)(uVar65 + uVar54 * 4);
        lVar31 = *(long *)&pRVar27[*(uint *)(uVar63 + 0x48 + lVar57)].ptr[2].numPrimitives;
        pfVar4 = (float *)(lVar30 + uVar49 * 4);
        lVar32 = *(long *)(lVar31 + lVar60);
        lVar33 = *(long *)(lVar58 + lVar47);
        pfVar20 = (float *)(lVar33 + uVar48 * 4);
        uVar48 = (ulong)*(uint *)(uVar63 + 8 + lVar57);
        puVar5 = (undefined4 *)(lVar32 + uVar48 * 4);
        uStack_c48 = *puVar5;
        lVar31 = *(long *)(lVar31 + lVar47);
        pfVar6 = (float *)(lVar31 + uVar48 * 4);
        uVar68 = (ulong)*(uint *)(uVar63 + 0x18 + lVar57);
        pfVar7 = (float *)(lVar32 + uVar68 * 4);
        lVar58 = *(long *)&pRVar27[*(uint *)(uVar63 + 0x4c + lVar57)].ptr[2].numPrimitives;
        lVar60 = *(long *)(lVar58 + lVar60);
        lVar47 = *(long *)(lVar58 + lVar47);
        uVar49 = (ulong)*(uint *)(uVar63 + 0x38 + lVar57);
        pfVar8 = (float *)(lVar32 + uVar49 * 4);
        fVar152 = pfVar8[2];
        uVar48 = (ulong)*(uint *)(uVar63 + 0xc + lVar57);
        puVar9 = (undefined4 *)(lVar60 + uVar48 * 4);
        uStack_c44 = *puVar9;
        uVar67 = (ulong)*(uint *)(uVar63 + 0x1c + lVar57);
        pfVar10 = (float *)(lVar60 + uVar67 * 4);
        uVar45 = *(uint *)(uVar63 + 0x3c + lVar57);
        pfVar11 = (float *)(lVar60 + (ulong)uVar45 * 4);
        fVar158 = pfVar11[2];
        pfVar12 = (float *)(lVar47 + uVar48 * 4);
        pfVar13 = (float *)(lVar31 + uVar68 * 4);
        pfVar21 = (float *)(lVar33 + uVar64 * 4);
        pfVar14 = (float *)(lVar47 + uVar67 * 4);
        pfVar15 = (float *)(lVar30 + uVar66 * 4);
        pfVar16 = (float *)(lVar31 + uVar49 * 4);
        pfVar22 = (float *)(lVar33 + uVar54 * 4);
        pfVar17 = (float *)(lVar47 + (ulong)uVar45 * 4);
        local_868 = 1.0 - local_848;
        fVar83 = *pfVar23 * local_868 + *pfVar4 * local_848;
        fVar95 = *pfVar1 * local_868 + *pfVar21 * local_848;
        fStack_ab0 = fStack_ab0 * local_868 + *pfVar13 * local_848;
        fStack_aac = fStack_aac * local_868 + *pfVar14 * local_848;
        local_858 = pfVar23[1] * local_868 + pfVar4[1] * local_848;
        fStack_854 = pfVar1[1] * local_868 + pfVar21[1] * local_848;
        fStack_850 = pfVar7[1] * local_868 + pfVar13[1] * local_848;
        fStack_84c = pfVar10[1] * local_868 + pfVar14[1] * local_848;
        fVar122 = *pfVar7 * local_868 + pfVar4[2] * local_848;
        fVar129 = *pfVar10 * local_868 + pfVar21[2] * local_848;
        fStack_aa0 = fStack_aa0 * local_868 + pfVar13[2] * local_848;
        fStack_a9c = fStack_a9c * local_868 + pfVar14[2] * local_848;
        fStack_844 = local_848;
        fStack_840 = local_848;
        fStack_83c = local_848;
        fVar196 = *pfVar24 * local_868 + *pfVar15 * local_848;
        fVar199 = *pfVar3 * local_868 + *pfVar22 * local_848;
        fVar200 = *pfVar8 * local_868 + *pfVar16 * local_848;
        fVar201 = *pfVar11 * local_868 + *pfVar17 * local_848;
        fVar166 = pfVar24[1] * local_868 + pfVar15[1] * local_848;
        fVar170 = pfVar3[1] * local_868 + pfVar22[1] * local_848;
        fVar171 = pfVar8[1] * local_868 + pfVar16[1] * local_848;
        fVar172 = pfVar11[1] * local_868 + pfVar17[1] * local_848;
        fStack_864 = local_868;
        fStack_860 = local_868;
        fStack_85c = local_868;
        local_c18 = pfVar24[2] * local_868 + pfVar15[2] * local_848;
        fStack_c14 = pfVar3[2] * local_868 + pfVar22[2] * local_848;
        fStack_c10 = fStack_c10 * local_868 + pfVar16[2] * local_848;
        fStack_c0c = fStack_c0c * local_868 + pfVar17[2] * local_848;
        fVar70 = (ray->org).field_0.m128[0];
        fVar82 = (ray->org).field_0.m128[1];
        fVar108 = (ray->org).field_0.m128[2];
        fVar156 = (*pfVar19 * local_868 + *pfVar2 * local_848) - fVar70;
        fStack_c54 = (*pfVar25 * local_868 + *pfVar20 * local_848) - fVar70;
        fStack_c50 = (fStack_c50 * local_868 + *pfVar6 * local_848) - fVar70;
        fStack_c4c = (fStack_c4c * local_868 + *pfVar12 * local_848) - fVar70;
        fVar180 = (pfVar19[1] * local_868 + pfVar2[1] * local_848) - fVar82;
        fVar183 = (pfVar25[1] * local_868 + pfVar20[1] * local_848) - fVar82;
        fVar186 = ((float)puVar5[1] * local_868 + pfVar6[1] * local_848) - fVar82;
        fVar189 = ((float)puVar9[1] * local_868 + pfVar12[1] * local_848) - fVar82;
        fVar84 = fVar83 - fVar70;
        fVar96 = fVar95 - fVar70;
        fVar97 = fStack_ab0 - fVar70;
        fVar99 = fStack_aac - fVar70;
        fVar85 = fVar196 - fVar70;
        fVar137 = fVar199 - fVar70;
        fVar98 = fVar200 - fVar70;
        fVar70 = fVar201 - fVar70;
        fVar174 = local_858 - fVar82;
        fVar176 = fStack_854 - fVar82;
        fVar177 = fStack_850 - fVar82;
        fVar178 = fStack_84c - fVar82;
        fVar71 = fVar166 - fVar82;
        fVar81 = fVar170 - fVar82;
        fVar150 = fVar171 - fVar82;
        fVar82 = fVar172 - fVar82;
        fVar133 = (pfVar19[2] * local_868 + pfVar2[2] * local_848) - fVar108;
        fVar134 = (pfVar25[2] * local_868 + pfVar20[2] * local_848) - fVar108;
        fStack_c20 = (fStack_c20 * local_868 + pfVar6[2] * local_848) - fVar108;
        fStack_c1c = (fStack_c1c * local_868 + pfVar12[2] * local_848) - fVar108;
        fVar123 = fVar122 - fVar108;
        fVar130 = fVar129 - fVar108;
        fVar131 = fStack_aa0 - fVar108;
        fVar132 = fStack_a9c - fVar108;
        fVar100 = local_c18 - fVar108;
        fVar106 = fStack_c14 - fVar108;
        fVar107 = fStack_c10 - fVar108;
        fVar108 = fStack_c0c - fVar108;
        fVar146 = fVar71 - fVar180;
        fVar151 = fVar81 - fVar183;
        fVar154 = fVar150 - fVar186;
        fVar155 = fVar82 - fVar189;
        fVar138 = fVar100 - fVar133;
        fVar145 = fVar106 - fVar134;
        fVar143 = fVar107 - fStack_c20;
        fVar144 = fVar108 - fStack_c1c;
        fVar157 = fVar85 - fVar156;
        fVar163 = fVar137 - fStack_c54;
        fVar164 = fVar98 - fStack_c50;
        fVar165 = fVar70 - fStack_c4c;
        fVar173 = (ray->dir).field_0.m128[0];
        fStack_b60 = (ray->dir).field_0.m128[1];
        fVar179 = (ray->dir).field_0.m128[2];
        fVar117 = (fVar146 * (fVar100 + fVar133) - fVar138 * (fVar71 + fVar180)) * fVar173 +
                  (fVar138 * (fVar85 + fVar156) - (fVar100 + fVar133) * fVar157) * fStack_b60 +
                  ((fVar71 + fVar180) * fVar157 - (fVar85 + fVar156) * fVar146) * fVar179;
        fVar121 = (fVar151 * (fVar106 + fVar134) - fVar145 * (fVar81 + fVar183)) * fVar173 +
                  (fVar145 * (fVar137 + fStack_c54) - (fVar106 + fVar134) * fVar163) * fStack_b60 +
                  ((fVar81 + fVar183) * fVar163 - (fVar137 + fStack_c54) * fVar151) * fVar179;
        local_818._0_8_ = CONCAT44(fVar121,fVar117);
        local_818._8_4_ =
             (fVar154 * (fVar107 + fStack_c20) - fVar143 * (fVar150 + fVar186)) * fVar173 +
             (fVar143 * (fVar98 + fStack_c50) - (fVar107 + fStack_c20) * fVar164) * fStack_b60 +
             ((fVar150 + fVar186) * fVar164 - (fVar98 + fStack_c50) * fVar154) * fVar179;
        local_818._12_4_ =
             (fVar155 * (fVar108 + fStack_c1c) - fVar144 * (fVar82 + fVar189)) * fVar173 +
             (fVar144 * (fVar70 + fStack_c4c) - (fVar108 + fStack_c1c) * fVar165) * fStack_b60 +
             ((fVar82 + fVar189) * fVar165 - (fVar70 + fStack_c4c) * fVar155) * fVar179;
        fVar181 = fVar180 - fVar174;
        fVar184 = fVar183 - fVar176;
        fVar187 = fVar186 - fVar177;
        fVar190 = fVar189 - fVar178;
        fVar109 = fVar133 - fVar123;
        fVar115 = fVar134 - fVar130;
        fVar116 = fStack_c20 - fVar131;
        fVar153 = fStack_c1c - fVar132;
        local_c28 = CONCAT44(fVar134,fVar133);
        local_7f8 = fVar156 - fVar84;
        fStack_7f4 = fStack_c54 - fVar96;
        fStack_7f0 = fStack_c50 - fVar97;
        fStack_7ec = fStack_c4c - fVar99;
        local_808._0_4_ =
             (fVar181 * (fVar133 + fVar123) - fVar109 * (fVar180 + fVar174)) * fVar173 +
             (fVar109 * (fVar156 + fVar84) - (fVar133 + fVar123) * local_7f8) * fStack_b60 +
             ((fVar180 + fVar174) * local_7f8 - (fVar156 + fVar84) * fVar181) * fVar179;
        local_808._4_4_ =
             (fVar184 * (fVar134 + fVar130) - fVar115 * (fVar183 + fVar176)) * fVar173 +
             (fVar115 * (fStack_c54 + fVar96) - (fVar134 + fVar130) * fStack_7f4) * fStack_b60 +
             ((fVar183 + fVar176) * fStack_7f4 - (fStack_c54 + fVar96) * fVar184) * fVar179;
        local_808._8_4_ =
             (fVar187 * (fStack_c20 + fVar131) - fVar116 * (fVar186 + fVar177)) * fVar173 +
             (fVar116 * (fStack_c50 + fVar97) - (fStack_c20 + fVar131) * fStack_7f0) * fStack_b60 +
             ((fVar186 + fVar177) * fStack_7f0 - (fStack_c50 + fVar97) * fVar187) * fVar179;
        local_808._12_4_ =
             (fVar190 * (fStack_c1c + fVar132) - fVar153 * (fVar189 + fVar178)) * fVar173 +
             (fVar153 * (fStack_c4c + fVar99) - (fStack_c1c + fVar132) * fStack_7ec) * fStack_b60 +
             ((fVar189 + fVar178) * fStack_7ec - (fStack_c4c + fVar99) * fVar190) * fVar179;
        fVar182 = fVar84 - fVar85;
        fVar185 = fVar96 - fVar137;
        fVar188 = fVar97 - fVar98;
        fVar191 = fVar99 - fVar70;
        fVar192 = fVar174 - fVar71;
        fVar193 = fVar176 - fVar81;
        fVar194 = fVar177 - fVar150;
        fVar195 = fVar178 - fVar82;
        local_7e8 = fVar123 - fVar100;
        fStack_7e4 = fVar130 - fVar106;
        fStack_7e0 = fVar131 - fVar107;
        fStack_7dc = fVar132 - fVar108;
        _local_b68 = CONCAT44(fStack_b60,fStack_b60);
        auVar135._0_4_ =
             (fVar192 * (fVar100 + fVar123) - local_7e8 * (fVar71 + fVar174)) * fVar173 +
             (local_7e8 * (fVar85 + fVar84) - (fVar100 + fVar123) * fVar182) * fStack_b60 +
             ((fVar71 + fVar174) * fVar182 - (fVar85 + fVar84) * fVar192) * fVar179;
        auVar135._4_4_ =
             (fVar193 * (fVar106 + fVar130) - fStack_7e4 * (fVar81 + fVar176)) * fVar173 +
             (fStack_7e4 * (fVar137 + fVar96) - (fVar106 + fVar130) * fVar185) * fStack_b60 +
             ((fVar81 + fVar176) * fVar185 - (fVar137 + fVar96) * fVar193) * fVar179;
        auVar135._8_4_ =
             (fVar194 * (fVar107 + fVar131) - fStack_7e0 * (fVar150 + fVar177)) * fVar173 +
             (fStack_7e0 * (fVar98 + fVar97) - (fVar107 + fVar131) * fVar188) * fStack_b60 +
             ((fVar150 + fVar177) * fVar188 - (fVar98 + fVar97) * fVar194) * fVar179;
        auVar135._12_4_ =
             (fVar195 * (fVar108 + fVar132) - fStack_7dc * (fVar82 + fVar178)) * fVar173 +
             (fStack_7dc * (fVar70 + fVar99) - (fVar108 + fVar132) * fVar191) * fStack_b60 +
             ((fVar82 + fVar178) * fVar191 - (fVar70 + fVar99) * fVar195) * fVar179;
        local_828 = fVar117 + local_808._0_4_ + auVar135._0_4_;
        fStack_824 = fVar121 + local_808._4_4_ + auVar135._4_4_;
        fStack_820 = local_818._8_4_ + local_808._8_4_ + auVar135._8_4_;
        fStack_81c = local_818._12_4_ + local_808._12_4_ + auVar135._12_4_;
        auVar72._8_4_ = local_818._8_4_;
        auVar72._0_8_ = local_818._0_8_;
        auVar72._12_4_ = local_818._12_4_;
        auVar139 = minps(auVar72,local_808);
        auVar139 = minps(auVar139,auVar135);
        auVar159._8_4_ = local_818._8_4_;
        auVar159._0_8_ = local_818._0_8_;
        auVar159._12_4_ = local_818._12_4_;
        auVar86 = maxps(auVar159,local_808);
        auVar86 = maxps(auVar86,auVar135);
        fVar70 = ABS(local_828) * 1.1920929e-07;
        fVar82 = ABS(fStack_824) * 1.1920929e-07;
        fVar108 = ABS(fStack_820) * 1.1920929e-07;
        fVar71 = ABS(fStack_81c) * 1.1920929e-07;
        auVar160._4_4_ = -(uint)(auVar86._4_4_ <= fVar82);
        auVar160._0_4_ = -(uint)(auVar86._0_4_ <= fVar70);
        auVar160._8_4_ = -(uint)(auVar86._8_4_ <= fVar108);
        auVar160._12_4_ = -(uint)(auVar86._12_4_ <= fVar71);
        auVar73._4_4_ = -(uint)(-fVar82 <= auVar139._4_4_);
        auVar73._0_4_ = -(uint)(-fVar70 <= auVar139._0_4_);
        auVar73._8_4_ = -(uint)(-fVar108 <= auVar139._8_4_);
        auVar73._12_4_ = -(uint)(-fVar71 <= auVar139._12_4_);
        auVar160 = auVar160 | auVar73;
        lVar58 = uVar63 + lVar57;
        uVar64 = (ulong)*(uint *)(uVar63 + 0x20 + lVar57);
        uVar48 = (ulong)*(uint *)(uVar63 + 0x24 + lVar57);
        uVar49 = (ulong)*(uint *)(uVar63 + 0x28 + lVar57);
        uVar54 = (ulong)*(uint *)(uVar63 + 0x2c + lVar57);
        iVar51 = movmskps(uVar45,auVar160);
        puVar18 = (undefined8 *)(lVar29 + uVar64 * 4);
        uVar41 = *puVar18;
        uVar42 = puVar18[1];
        _local_c38 = *(undefined1 (*) [16])(lVar30 + uVar64 * 4);
        auVar124 = local_c38._0_12_;
        puVar18 = (undefined8 *)(uVar65 + uVar48 * 4);
        local_8a8 = *puVar18;
        uStack_8a0 = puVar18[1];
        puVar18 = (undefined8 *)(lVar33 + uVar48 * 4);
        local_878 = *puVar18;
        uStack_870 = puVar18[1];
        puVar18 = (undefined8 *)(lVar32 + uVar49 * 4);
        local_8c8 = *puVar18;
        uStack_8c0 = puVar18[1];
        puVar18 = (undefined8 *)(lVar31 + uVar49 * 4);
        local_898 = *puVar18;
        uStack_890 = puVar18[1];
        puVar18 = (undefined8 *)(lVar60 + uVar54 * 4);
        local_8b8 = *puVar18;
        uStack_8b0 = puVar18[1];
        puVar18 = (undefined8 *)(lVar47 + uVar54 * 4);
        local_888 = *puVar18;
        uStack_880 = puVar18[1];
        context = local_c40;
        auVar86 = _DAT_01feca10;
        local_c08 = fVar152;
        fStack_c04 = fVar158;
        local_b50 = pSVar55;
        if (iVar51 != 0) {
          auVar140._4_4_ = fVar184 * fStack_7e4 - fVar115 * fVar193;
          auVar140._0_4_ = fVar181 * local_7e8 - fVar109 * fVar192;
          auVar74._4_4_ = -(uint)(ABS(fVar145 * fVar184) < ABS(fVar115 * fVar193));
          auVar74._0_4_ = -(uint)(ABS(fVar138 * fVar181) < ABS(fVar109 * fVar192));
          auVar74._8_4_ = -(uint)(ABS(fVar143 * fVar187) < ABS(fVar116 * fVar194));
          auVar74._12_4_ = -(uint)(ABS(fVar144 * fVar190) < ABS(fVar153 * fVar195));
          auVar140._8_4_ = fVar187 * fStack_7e0 - fVar116 * fVar194;
          auVar140._12_4_ = fVar190 * fStack_7dc - fVar153 * fVar195;
          auVar39._4_4_ = fVar151 * fVar115 - fVar145 * fVar184;
          auVar39._0_4_ = fVar146 * fVar109 - fVar138 * fVar181;
          auVar39._8_4_ = fVar154 * fVar116 - fVar143 * fVar187;
          auVar39._12_4_ = fVar155 * fVar153 - fVar144 * fVar190;
          local_918 = blendvps(auVar140,auVar39,auVar74);
          auVar125._0_4_ = fVar138 * local_7f8 - fVar157 * fVar109;
          auVar125._4_4_ = fVar145 * fStack_7f4 - fVar163 * fVar115;
          auVar125._8_4_ = fVar143 * fStack_7f0 - fVar164 * fVar116;
          auVar125._12_4_ = fVar144 * fStack_7ec - fVar165 * fVar153;
          auVar197._0_4_ = fVar109 * fVar182 - local_7f8 * local_7e8;
          auVar197._4_4_ = fVar115 * fVar185 - fStack_7f4 * fStack_7e4;
          auVar197._8_4_ = fVar116 * fVar188 - fStack_7f0 * fStack_7e0;
          auVar197._12_4_ = fVar153 * fVar191 - fStack_7ec * fStack_7dc;
          auVar75._4_4_ = -(uint)(ABS(fVar163 * fVar115) < ABS(fStack_7f4 * fStack_7e4));
          auVar75._0_4_ = -(uint)(ABS(fVar157 * fVar109) < ABS(local_7f8 * local_7e8));
          auVar75._8_4_ = -(uint)(ABS(fVar164 * fVar116) < ABS(fStack_7f0 * fStack_7e0));
          auVar75._12_4_ = -(uint)(ABS(fVar165 * fVar153) < ABS(fStack_7ec * fStack_7dc));
          local_908 = blendvps(auVar197,auVar125,auVar75);
          fVar71 = (float)DAT_01feca10;
          fVar81 = DAT_01feca10._4_4_;
          fVar150 = DAT_01feca10._12_4_;
          auVar147._0_4_ = local_7f8 * fVar192 - fVar181 * fVar182;
          auVar147._4_4_ = fStack_7f4 * fVar193 - fVar184 * fVar185;
          auVar147._8_4_ = fStack_7f0 * fVar194 - fVar187 * fVar188;
          auVar147._12_4_ = fStack_7ec * fVar195 - fVar190 * fVar191;
          auVar76._4_4_ = -(uint)(ABS(fVar151 * fStack_7f4) < ABS(fVar184 * fVar185));
          auVar76._0_4_ = -(uint)(ABS(fVar146 * local_7f8) < ABS(fVar181 * fVar182));
          auVar76._8_4_ = -(uint)(ABS(fVar154 * fStack_7f0) < ABS(fVar187 * fVar188));
          auVar76._12_4_ = -(uint)(ABS(fVar155 * fStack_7ec) < ABS(fVar190 * fVar191));
          auVar38._4_4_ = fVar163 * fVar184 - fVar151 * fStack_7f4;
          auVar38._0_4_ = fVar157 * fVar181 - fVar146 * local_7f8;
          auVar38._8_4_ = fVar164 * fVar187 - fVar154 * fStack_7f0;
          auVar38._12_4_ = fVar165 * fVar190 - fVar155 * fStack_7ec;
          local_8f8 = blendvps(auVar147,auVar38,auVar76);
          fVar70 = fVar173 * local_918._0_4_ +
                   fStack_b60 * local_908._0_4_ + fVar179 * local_8f8._0_4_;
          fVar82 = fVar173 * local_918._4_4_ +
                   fStack_b60 * local_908._4_4_ + fVar179 * local_8f8._4_4_;
          fVar108 = fVar173 * local_918._8_4_ +
                    fStack_b60 * local_908._8_4_ + fVar179 * local_8f8._8_4_;
          fVar173 = fVar173 * local_918._12_4_ +
                    fStack_b60 * local_908._12_4_ + fVar179 * local_8f8._12_4_;
          auVar167._0_4_ = fVar70 + fVar70;
          auVar167._4_4_ = fVar82 + fVar82;
          auVar167._8_4_ = fVar108 + fVar108;
          auVar167._12_4_ = fVar173 + fVar173;
          auVar89._0_4_ = fVar180 * local_908._0_4_ + fVar133 * local_8f8._0_4_;
          auVar89._4_4_ = fVar183 * local_908._4_4_ + fVar134 * local_8f8._4_4_;
          auVar89._8_4_ = fVar186 * local_908._8_4_ + fStack_c20 * local_8f8._8_4_;
          auVar89._12_4_ = fVar189 * local_908._12_4_ + fStack_c1c * local_8f8._12_4_;
          fVar84 = fVar156 * local_918._0_4_ + auVar89._0_4_;
          fVar85 = fStack_c54 * local_918._4_4_ + auVar89._4_4_;
          fVar96 = fStack_c50 * local_918._8_4_ + auVar89._8_4_;
          fVar137 = fStack_c4c * local_918._12_4_ + auVar89._12_4_;
          auVar139 = rcpps(auVar89,auVar167);
          fVar70 = auVar139._0_4_;
          fVar82 = auVar139._4_4_;
          fVar173 = auVar139._8_4_;
          fVar179 = auVar139._12_4_;
          fVar108 = DAT_01feca10._8_4_;
          local_928._0_4_ =
               ((fVar71 - auVar167._0_4_ * fVar70) * fVar70 + fVar70) * (fVar84 + fVar84);
          local_928._4_4_ =
               ((fVar81 - auVar167._4_4_ * fVar82) * fVar82 + fVar82) * (fVar85 + fVar85);
          fStack_920 = ((fVar108 - auVar167._8_4_ * fVar173) * fVar173 + fVar173) *
                       (fVar96 + fVar96);
          fStack_91c = ((fVar150 - auVar167._12_4_ * fVar179) * fVar179 + fVar179) *
                       (fVar137 + fVar137);
          fVar70 = ray->tfar;
          fVar82 = (ray->org).field_0.m128[3];
          auVar102._0_4_ =
               -(uint)((float)local_928._0_4_ <= fVar70 && fVar82 <= (float)local_928._0_4_);
          auVar102._4_4_ =
               -(uint)((float)local_928._4_4_ <= fVar70 && fVar82 <= (float)local_928._4_4_);
          auVar102._8_4_ = -(uint)(fStack_920 <= fVar70 && fVar82 <= fStack_920);
          auVar102._12_4_ = -(uint)(fStack_91c <= fVar70 && fVar82 <= fStack_91c);
          auVar168._0_4_ = -(uint)(auVar167._0_4_ != 0.0) & auVar160._0_4_ & auVar102._0_4_;
          auVar168._4_4_ = -(uint)(auVar167._4_4_ != 0.0) & auVar160._4_4_ & auVar102._4_4_;
          auVar168._8_4_ = -(uint)(auVar167._8_4_ != 0.0) & auVar160._8_4_ & auVar102._8_4_;
          auVar168._12_4_ = -(uint)(auVar167._12_4_ != 0.0) & auVar160._12_4_ & auVar102._12_4_;
          uVar45 = movmskps((int)uVar65,auVar168);
          uVar65 = (ulong)uVar45;
          if (uVar45 != 0) {
            auVar44._4_4_ = fStack_824;
            auVar44._0_4_ = local_828;
            auVar44._8_4_ = fStack_820;
            auVar44._12_4_ = fStack_81c;
            local_8e8._8_8_ = uStack_830;
            local_8e8._0_8_ = local_838;
            auVar139 = rcpps(auVar102,auVar44);
            fVar70 = auVar139._0_4_;
            fVar82 = auVar139._4_4_;
            fVar173 = auVar139._8_4_;
            fVar179 = auVar139._12_4_;
            fVar70 = (float)(-(uint)(1e-18 <= ABS(local_828)) &
                            (uint)((fVar71 - local_828 * fVar70) * fVar70 + fVar70));
            fVar82 = (float)(-(uint)(1e-18 <= ABS(fStack_824)) &
                            (uint)((fVar81 - fStack_824 * fVar82) * fVar82 + fVar82));
            fVar173 = (float)(-(uint)(1e-18 <= ABS(fStack_820)) &
                             (uint)((fVar108 - fStack_820 * fVar173) * fVar173 + fVar173));
            fVar179 = (float)(-(uint)(1e-18 <= ABS(fStack_81c)) &
                             (uint)((fVar150 - fStack_81c * fVar179) * fVar179 + fVar179));
            auVar119._0_4_ = fVar117 * fVar70;
            auVar119._4_4_ = fVar121 * fVar82;
            auVar119._8_4_ = local_818._8_4_ * fVar173;
            auVar119._12_4_ = local_818._12_4_ * fVar179;
            auVar139 = minps(auVar119,_DAT_01feca10);
            auVar175._0_4_ = fVar70 * local_808._0_4_;
            auVar175._4_4_ = fVar82 * local_808._4_4_;
            auVar175._8_4_ = fVar173 * local_808._8_4_;
            auVar175._12_4_ = fVar179 * local_808._12_4_;
            auVar111 = minps(auVar175,_DAT_01feca10);
            auVar90._0_4_ = fVar71 - auVar139._0_4_;
            auVar90._4_4_ = fVar81 - auVar139._4_4_;
            auVar90._8_4_ = fVar108 - auVar139._8_4_;
            auVar90._12_4_ = fVar150 - auVar139._12_4_;
            auVar103._0_4_ = fVar71 - auVar111._0_4_;
            auVar103._4_4_ = fVar81 - auVar111._4_4_;
            auVar103._8_4_ = fVar108 - auVar111._8_4_;
            auVar103._12_4_ = fVar150 - auVar111._12_4_;
            local_948 = blendvps(auVar139,auVar90,local_8e8);
            local_938 = blendvps(auVar111,auVar103,local_8e8);
            uVar64 = (ulong)(byte)uVar45;
            auVar139 = local_b78;
            fVar108 = local_b88;
            fVar70 = fStack_b84;
            fVar71 = fStack_b80;
            fVar81 = fStack_b7c;
            fVar150 = local_be8;
            fVar84 = fStack_be4;
            fVar85 = fStack_be0;
            fVar96 = fStack_bdc;
            fVar137 = local_bf8;
            fVar97 = fStack_bf4;
            fVar98 = fStack_bf0;
            fVar99 = fStack_bec;
            fVar179 = local_b98;
            fVar100 = fStack_b94;
            fVar106 = fStack_b90;
            fVar107 = fStack_b8c;
            fVar153 = local_ba8;
            fVar109 = fStack_ba4;
            fVar115 = fStack_ba0;
            fVar116 = fStack_b9c;
            fVar82 = local_bb8;
            fVar117 = fStack_bb4;
            fVar121 = fStack_bb0;
            fVar123 = fStack_bac;
            fVar173 = local_bc8;
            fVar130 = fStack_bc4;
            fVar131 = fStack_bc0;
            fVar132 = fStack_bbc;
            fVar145 = local_bd8;
            fVar133 = fStack_bd4;
            fVar134 = fStack_bd0;
            fVar138 = fStack_bcc;
            fVar143 = fStack_c00;
            fVar144 = fStack_bfc;
            fStack_b5c = fStack_b60;
            do {
              uVar65 = 0;
              if (uVar64 != 0) {
                for (; (uVar64 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
                }
              }
              h.geomID = *(uint *)(lVar58 + 0x40 + uVar65 * 4);
              pGVar28 = (pSVar55->geometries).items[h.geomID].ptr;
              if ((pGVar28->mask & ray->mask) == 0) {
                uVar64 = uVar64 ^ 1L << (uVar65 & 0x3f);
                uVar65 = CONCAT71((uint7)(uint3)(h.geomID >> 8),1);
              }
              else {
                pRVar34 = context->args;
                if ((pRVar34->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar28->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar65 = 0;
                }
                else {
                  h.u = *(float *)(local_948 + uVar65 * 4);
                  h.v = *(float *)(local_938 + uVar65 * 4);
                  args.context = context->user;
                  h.primID = *(uint *)(lVar58 + 0x50 + uVar65 * 4);
                  h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_918 + uVar65 * 4);
                  h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_908 + uVar65 * 4);
                  h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_8f8 + uVar65 * 4);
                  h.instID[0] = (args.context)->instID[0];
                  h.instPrimID[0] = (args.context)->instPrimID[0];
                  local_c58 = ray->tfar;
                  ray->tfar = *(float *)(local_928 + uVar65 * 4);
                  local_c5c = -1;
                  args.valid = &local_c5c;
                  args.geometryUserPtr = pGVar28->userPtr;
                  args.hit = (RTCHitN *)&h;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if ((pGVar28->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     (local_c28 = lVar58, (*pGVar28->occlusionFilterN)(&args), context = local_c40,
                     pSVar55 = local_b50, lVar58 = local_c28, auVar139 = local_b78,
                     fVar108 = local_b88, fVar70 = fStack_b84, fVar71 = fStack_b80,
                     fVar81 = fStack_b7c, auVar86 = _DAT_01feca10, fVar150 = local_be8,
                     fVar84 = fStack_be4, fVar85 = fStack_be0, fVar96 = fStack_bdc,
                     fVar137 = local_bf8, fVar97 = fStack_bf4, fVar98 = fStack_bf0,
                     fVar99 = fStack_bec, fVar179 = local_b98, fVar100 = fStack_b94,
                     fVar106 = fStack_b90, fVar107 = fStack_b8c, fVar153 = local_ba8,
                     fVar109 = fStack_ba4, fVar115 = fStack_ba0, fVar116 = fStack_b9c,
                     fVar82 = local_bb8, fVar117 = fStack_bb4, fVar121 = fStack_bb0,
                     fVar123 = fStack_bac, fVar173 = local_bc8, fVar130 = fStack_bc4,
                     fVar131 = fStack_bc0, fVar132 = fStack_bbc, fVar145 = local_bd8,
                     fVar133 = fStack_bd4, fVar134 = fStack_bd0, fVar138 = fStack_bcc,
                     fVar152 = local_c08, fVar158 = fStack_c04, fVar143 = fStack_c00,
                     fVar144 = fStack_bfc, *args.valid != 0)) {
                    if (pRVar34->filter != (RTCFilterFunctionN)0x0) {
                      if (((pRVar34->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar28->field_8).field_0x2 & 0x40) != 0)) {
                        (*pRVar34->filter)(&args);
                        context = local_c40;
                        auVar139 = local_b78;
                        fVar108 = local_b88;
                        fVar70 = fStack_b84;
                        fVar71 = fStack_b80;
                        fVar81 = fStack_b7c;
                        auVar86 = _DAT_01feca10;
                        fVar150 = local_be8;
                        fVar84 = fStack_be4;
                        fVar85 = fStack_be0;
                        fVar96 = fStack_bdc;
                        fVar137 = local_bf8;
                        fVar97 = fStack_bf4;
                        fVar98 = fStack_bf0;
                        fVar99 = fStack_bec;
                        fVar179 = local_b98;
                        fVar100 = fStack_b94;
                        fVar106 = fStack_b90;
                        fVar107 = fStack_b8c;
                        fVar153 = local_ba8;
                        fVar109 = fStack_ba4;
                        fVar115 = fStack_ba0;
                        fVar116 = fStack_b9c;
                        fVar82 = local_bb8;
                        fVar117 = fStack_bb4;
                        fVar121 = fStack_bb0;
                        fVar123 = fStack_bac;
                        fVar173 = local_bc8;
                        fVar130 = fStack_bc4;
                        fVar131 = fStack_bc0;
                        fVar132 = fStack_bbc;
                        fVar145 = local_bd8;
                        fVar133 = fStack_bd4;
                        fVar134 = fStack_bd0;
                        fVar138 = fStack_bcc;
                        fVar152 = local_c08;
                        fVar158 = fStack_c04;
                        fVar143 = fStack_c00;
                        fVar144 = fStack_bfc;
                      }
                      if (*args.valid == 0) goto LAB_0022e3bf;
                    }
                    uVar65 = 0;
                  }
                  else {
LAB_0022e3bf:
                    ray->tfar = local_c58;
                    uVar64 = uVar64 ^ 1L << (uVar65 & 0x3f);
                    uVar65 = CONCAT71((int7)((ulong)args.valid >> 8),1);
                  }
                }
              }
              if ((char)uVar65 == '\0') goto LAB_0022ed69;
            } while (uVar64 != 0);
            auVar124 = local_c38._0_12_;
          }
        }
        local_a48 = (float)uVar41;
        fStack_a44 = (float)((ulong)uVar41 >> 0x20);
        fStack_a40 = (float)uVar42;
        fVar70 = (ray->org).field_0.m128[0];
        fVar82 = (ray->org).field_0.m128[1];
        fVar108 = (ray->org).field_0.m128[2];
        fVar132 = (local_a48 * local_868 + auVar124._0_4_ * local_848) - fVar70;
        fVar133 = ((float)local_8a8 * fStack_864 + (float)local_878 * fStack_844) - fVar70;
        fStack_c20 = ((float)local_8c8 * fStack_860 + (float)local_898 * fStack_840) - fVar70;
        fStack_c1c = ((float)local_8b8 * fStack_85c + (float)local_888 * fStack_83c) - fVar70;
        fVar177 = (fStack_a44 * local_868 + auVar124._4_4_ * local_848) - fVar82;
        fVar180 = (local_8a8._4_4_ * fStack_864 + local_878._4_4_ * fStack_844) - fVar82;
        fVar182 = (local_8c8._4_4_ * fStack_860 + local_898._4_4_ * fStack_840) - fVar82;
        fVar184 = (local_8b8._4_4_ * fStack_85c + local_888._4_4_ * fStack_83c) - fVar82;
        fVar134 = (fStack_a40 * local_868 + auVar124._8_4_ * local_848) - fVar108;
        fVar138 = ((float)uStack_8a0 * fStack_864 + (float)uStack_870 * fStack_844) - fVar108;
        fVar145 = ((float)uStack_8c0 * fStack_860 + (float)uStack_890 * fStack_840) - fVar108;
        fVar143 = ((float)uStack_8b0 * fStack_85c + (float)uStack_880 * fStack_83c) - fVar108;
        fVar196 = fVar196 - fVar70;
        fVar199 = fVar199 - fVar70;
        fVar200 = fVar200 - fVar70;
        fVar201 = fVar201 - fVar70;
        fVar166 = fVar166 - fVar82;
        fVar170 = fVar170 - fVar82;
        fVar171 = fVar171 - fVar82;
        fVar172 = fVar172 - fVar82;
        fVar84 = local_c18 - fVar108;
        fVar99 = fStack_c14 - fVar108;
        fVar106 = fStack_c10 - fVar108;
        fVar109 = fStack_c0c - fVar108;
        fVar83 = fVar83 - fVar70;
        fVar95 = fVar95 - fVar70;
        fVar163 = fStack_ab0 - fVar70;
        fVar70 = fStack_aac - fVar70;
        fVar155 = local_858 - fVar82;
        fVar156 = fStack_854 - fVar82;
        fVar157 = fStack_850 - fVar82;
        fVar82 = fStack_84c - fVar82;
        fVar122 = fVar122 - fVar108;
        fVar129 = fVar129 - fVar108;
        fVar131 = fStack_aa0 - fVar108;
        fVar108 = fStack_a9c - fVar108;
        fVar144 = fVar83 - fVar132;
        fVar152 = fVar95 - fVar133;
        fStack_aa0 = fVar163 - fStack_c20;
        fStack_a9c = fVar70 - fStack_c1c;
        local_c38._0_4_ = fVar155 - fVar177;
        local_c38._4_4_ = fVar156 - fVar180;
        fStack_c30 = fVar157 - fVar182;
        fStack_c2c = fVar82 - fVar184;
        fVar158 = fVar122 - fVar134;
        fVar146 = fVar129 - fVar138;
        fVar151 = fVar131 - fVar145;
        fVar154 = fVar108 - fVar143;
        fVar173 = (ray->dir).field_0.m128[0];
        fStack_c10 = (ray->dir).field_0.m128[1];
        fStack_c50 = (ray->dir).field_0.m128[2];
        fVar164 = ((float)local_c38._0_4_ * (fVar122 + fVar134) - fVar158 * (fVar155 + fVar177)) *
                  fVar173 + (fVar158 * (fVar83 + fVar132) - (fVar122 + fVar134) * fVar144) *
                            fStack_c10 +
                            ((fVar155 + fVar177) * fVar144 -
                            (fVar83 + fVar132) * (float)local_c38._0_4_) * fStack_c50;
        fVar165 = ((float)local_c38._4_4_ * (fVar129 + fVar138) - fVar146 * (fVar156 + fVar180)) *
                  fVar173 + (fVar146 * (fVar95 + fVar133) - (fVar129 + fVar138) * fVar152) *
                            fStack_c10 +
                            ((fVar156 + fVar180) * fVar152 -
                            (fVar95 + fVar133) * (float)local_c38._4_4_) * fStack_c50;
        fVar174 = (fStack_c30 * (fVar131 + fVar145) - fVar151 * (fVar157 + fVar182)) * fVar173 +
                  (fVar151 * (fVar163 + fStack_c20) - (fVar131 + fVar145) * fStack_aa0) * fStack_c10
                  + ((fVar157 + fVar182) * fStack_aa0 - (fVar163 + fStack_c20) * fStack_c30) *
                    fStack_c50;
        fVar176 = (fStack_c2c * (fVar108 + fVar143) - fVar154 * (fVar82 + fVar184)) * fVar173 +
                  (fVar154 * (fVar70 + fStack_c1c) - (fVar108 + fVar143) * fStack_a9c) * fStack_c10
                  + ((fVar82 + fVar184) * fStack_a9c - (fVar70 + fStack_c1c) * fStack_c2c) *
                    fStack_c50;
        fVar179 = fVar177 - fVar166;
        fVar71 = fVar180 - fVar170;
        fVar81 = fVar182 - fVar171;
        fVar150 = fVar184 - fVar172;
        fVar116 = fVar134 - fVar84;
        fVar117 = fVar138 - fVar99;
        fVar123 = fVar145 - fVar106;
        fVar130 = fVar143 - fVar109;
        fVar178 = fVar132 - fVar196;
        fVar181 = fVar133 - fVar199;
        fVar183 = fStack_c20 - fVar200;
        fVar185 = fStack_c1c - fVar201;
        local_c28 = CONCAT44(fVar133,fVar132);
        auVar161._0_4_ =
             (fVar179 * (fVar134 + fVar84) - fVar116 * (fVar177 + fVar166)) * fVar173 +
             (fVar116 * (fVar132 + fVar196) - (fVar134 + fVar84) * fVar178) * fStack_c10 +
             ((fVar177 + fVar166) * fVar178 - (fVar132 + fVar196) * fVar179) * fStack_c50;
        auVar161._4_4_ =
             (fVar71 * (fVar138 + fVar99) - fVar117 * (fVar180 + fVar170)) * fVar173 +
             (fVar117 * (fVar133 + fVar199) - (fVar138 + fVar99) * fVar181) * fStack_c10 +
             ((fVar180 + fVar170) * fVar181 - (fVar133 + fVar199) * fVar71) * fStack_c50;
        auVar161._8_4_ =
             (fVar81 * (fVar145 + fVar106) - fVar123 * (fVar182 + fVar171)) * fVar173 +
             (fVar123 * (fStack_c20 + fVar200) - (fVar145 + fVar106) * fVar183) * fStack_c10 +
             ((fVar182 + fVar171) * fVar183 - (fStack_c20 + fVar200) * fVar81) * fStack_c50;
        auVar161._12_4_ =
             (fVar150 * (fVar143 + fVar109) - fVar130 * (fVar184 + fVar172)) * fVar173 +
             (fVar130 * (fStack_c1c + fVar201) - (fVar143 + fVar109) * fVar185) * fStack_c10 +
             ((fVar184 + fVar172) * fVar185 - (fStack_c1c + fVar201) * fVar150) * fStack_c50;
        fVar85 = fVar196 - fVar83;
        fVar96 = fVar199 - fVar95;
        fVar137 = fVar200 - fVar163;
        fVar97 = fVar201 - fVar70;
        fVar98 = fVar166 - fVar155;
        fVar100 = fVar170 - fVar156;
        fVar107 = fVar171 - fVar157;
        fVar115 = fVar172 - fVar82;
        fVar153 = fVar84 - fVar122;
        fVar121 = fVar99 - fVar129;
        fStack_b60 = fVar106 - fVar131;
        fStack_b5c = fVar109 - fVar108;
        _local_b68 = CONCAT44(fVar121,fVar153);
        _local_c18 = CONCAT44(fStack_c10,fStack_c10);
        auVar77._0_4_ =
             (fVar98 * (fVar122 + fVar84) - fVar153 * (fVar155 + fVar166)) * fVar173 +
             (fVar153 * (fVar83 + fVar196) - (fVar122 + fVar84) * fVar85) * fStack_c10 +
             ((fVar155 + fVar166) * fVar85 - (fVar83 + fVar196) * fVar98) * fStack_c50;
        auVar77._4_4_ =
             (fVar100 * (fVar129 + fVar99) - fVar121 * (fVar156 + fVar170)) * fVar173 +
             (fVar121 * (fVar95 + fVar199) - (fVar129 + fVar99) * fVar96) * fStack_c10 +
             ((fVar156 + fVar170) * fVar96 - (fVar95 + fVar199) * fVar100) * fStack_c50;
        auVar77._8_4_ =
             (fVar107 * (fVar131 + fVar106) - fStack_b60 * (fVar157 + fVar171)) * fVar173 +
             (fStack_b60 * (fVar163 + fVar200) - (fVar131 + fVar106) * fVar137) * fStack_c10 +
             ((fVar157 + fVar171) * fVar137 - (fVar163 + fVar200) * fVar107) * fStack_c50;
        auVar77._12_4_ =
             (fVar115 * (fVar108 + fVar109) - fStack_b5c * (fVar82 + fVar172)) * fVar173 +
             (fStack_b5c * (fVar70 + fVar201) - (fVar108 + fVar109) * fVar97) * fStack_c10 +
             ((fVar82 + fVar172) * fVar97 - (fVar70 + fVar201) * fVar115) * fStack_c50;
        fVar99 = fVar164 + auVar161._0_4_ + auVar77._0_4_;
        fVar106 = fVar165 + auVar161._4_4_ + auVar77._4_4_;
        fVar109 = fVar174 + auVar161._8_4_ + auVar77._8_4_;
        fVar131 = fVar176 + auVar161._12_4_ + auVar77._12_4_;
        auVar91._4_4_ = fVar165;
        auVar91._0_4_ = fVar164;
        auVar91._8_4_ = fVar174;
        auVar91._12_4_ = fVar176;
        auVar139 = minps(auVar91,auVar161);
        auVar139 = minps(auVar139,auVar77);
        auVar126._4_4_ = fVar165;
        auVar126._0_4_ = fVar164;
        auVar126._8_4_ = fVar174;
        auVar126._12_4_ = fVar176;
        auVar111 = maxps(auVar126,auVar161);
        auVar111 = maxps(auVar111,auVar77);
        fVar70 = ABS(fVar99) * 1.1920929e-07;
        fVar82 = ABS(fVar106) * 1.1920929e-07;
        fVar108 = ABS(fVar109) * 1.1920929e-07;
        fVar84 = ABS(fVar131) * 1.1920929e-07;
        auVar127._4_4_ = -(uint)(auVar111._4_4_ <= fVar82);
        auVar127._0_4_ = -(uint)(auVar111._0_4_ <= fVar70);
        auVar127._8_4_ = -(uint)(auVar111._8_4_ <= fVar108);
        auVar127._12_4_ = -(uint)(auVar111._12_4_ <= fVar84);
        auVar92._4_4_ = -(uint)(-fVar82 <= auVar139._4_4_);
        auVar92._0_4_ = -(uint)(-fVar70 <= auVar139._0_4_);
        auVar92._8_4_ = -(uint)(-fVar108 <= auVar139._8_4_);
        auVar92._12_4_ = -(uint)(-fVar84 <= auVar139._12_4_);
        auVar127 = auVar127 | auVar92;
        iVar51 = movmskps((int)uVar65,auVar127);
        fStack_c4c = fStack_c50;
        fStack_c0c = fStack_c10;
        fStack_ab0 = fVar182;
        fStack_aac = fVar184;
        if (iVar51 != 0) {
          auVar141._0_4_ = (float)local_c38._0_4_ * fVar116 - fVar158 * fVar179;
          auVar141._4_4_ = (float)local_c38._4_4_ * fVar117 - fVar146 * fVar71;
          auVar141._8_4_ = fStack_c30 * fVar123 - fVar151 * fVar81;
          auVar141._12_4_ = fStack_c2c * fVar130 - fVar154 * fVar150;
          auVar162._0_4_ = fVar179 * fVar153 - fVar116 * fVar98;
          auVar162._4_4_ = fVar71 * fVar121 - fVar117 * fVar100;
          auVar162._8_4_ = fVar81 * fStack_b60 - fVar123 * fVar107;
          auVar162._12_4_ = fVar150 * fStack_b5c - fVar130 * fVar115;
          auVar78._4_4_ = -(uint)(ABS(fVar146 * fVar71) < ABS(fVar117 * fVar100));
          auVar78._0_4_ = -(uint)(ABS(fVar158 * fVar179) < ABS(fVar116 * fVar98));
          auVar78._8_4_ = -(uint)(ABS(fVar151 * fVar81) < ABS(fVar123 * fVar107));
          auVar78._12_4_ = -(uint)(ABS(fVar154 * fVar150) < ABS(fVar130 * fVar115));
          local_918 = blendvps(auVar162,auVar141,auVar78);
          auVar198._0_4_ = fVar116 * fVar85 - fVar178 * fVar153;
          auVar198._4_4_ = fVar117 * fVar96 - fVar181 * fVar121;
          auVar198._8_4_ = fVar123 * fVar137 - fVar183 * fStack_b60;
          auVar198._12_4_ = fVar130 * fVar97 - fVar185 * fStack_b5c;
          auVar79._4_4_ = -(uint)(ABS(fVar152 * fVar117) < ABS(fVar181 * fVar121));
          auVar79._0_4_ = -(uint)(ABS(fVar144 * fVar116) < ABS(fVar178 * fVar153));
          auVar79._8_4_ = -(uint)(ABS(fStack_aa0 * fVar123) < ABS(fVar183 * fStack_b60));
          auVar79._12_4_ = -(uint)(ABS(fStack_a9c * fVar130) < ABS(fVar185 * fStack_b5c));
          auVar40._4_4_ = fVar146 * fVar181 - fVar152 * fVar117;
          auVar40._0_4_ = fVar158 * fVar178 - fVar144 * fVar116;
          auVar40._8_4_ = fVar151 * fVar183 - fStack_aa0 * fVar123;
          auVar40._12_4_ = fVar154 * fVar185 - fStack_a9c * fVar130;
          local_908 = blendvps(auVar198,auVar40,auVar79);
          auVar120._0_4_ = fVar144 * fVar179 - (float)local_c38._0_4_ * fVar178;
          auVar120._4_4_ = fVar152 * fVar71 - (float)local_c38._4_4_ * fVar181;
          auVar120._8_4_ = fStack_aa0 * fVar81 - fStack_c30 * fVar183;
          auVar120._12_4_ = fStack_a9c * fVar150 - fStack_c2c * fVar185;
          auVar136._0_4_ = fVar178 * fVar98 - fVar179 * fVar85;
          auVar136._4_4_ = fVar181 * fVar100 - fVar71 * fVar96;
          auVar136._8_4_ = fVar183 * fVar107 - fVar81 * fVar137;
          auVar136._12_4_ = fVar185 * fVar115 - fVar150 * fVar97;
          auVar80._4_4_ = -(uint)(ABS((float)local_c38._4_4_ * fVar181) < ABS(fVar71 * fVar96));
          auVar80._0_4_ = -(uint)(ABS((float)local_c38._0_4_ * fVar178) < ABS(fVar179 * fVar85));
          auVar80._8_4_ = -(uint)(ABS(fStack_c30 * fVar183) < ABS(fVar81 * fVar137));
          auVar80._12_4_ = -(uint)(ABS(fStack_c2c * fVar185) < ABS(fVar150 * fVar97));
          local_8f8 = blendvps(auVar136,auVar120,auVar80);
          fVar70 = fVar173 * local_918._0_4_ +
                   fStack_c10 * local_908._0_4_ + fStack_c50 * local_8f8._0_4_;
          fVar82 = fVar173 * local_918._4_4_ +
                   fStack_c10 * local_908._4_4_ + fStack_c50 * local_8f8._4_4_;
          fVar108 = fVar173 * local_918._8_4_ +
                    fStack_c10 * local_908._8_4_ + fStack_c50 * local_8f8._8_4_;
          fVar173 = fVar173 * local_918._12_4_ +
                    fStack_c10 * local_908._12_4_ + fStack_c50 * local_8f8._12_4_;
          auVar148._0_4_ = fVar70 + fVar70;
          auVar148._4_4_ = fVar82 + fVar82;
          auVar148._8_4_ = fVar108 + fVar108;
          auVar148._12_4_ = fVar173 + fVar173;
          auVar93._0_4_ = fVar177 * local_908._0_4_ + fVar134 * local_8f8._0_4_;
          auVar93._4_4_ = fVar180 * local_908._4_4_ + fVar138 * local_8f8._4_4_;
          auVar93._8_4_ = fVar182 * local_908._8_4_ + fVar145 * local_8f8._8_4_;
          auVar93._12_4_ = fVar184 * local_908._12_4_ + fVar143 * local_8f8._12_4_;
          fVar84 = fVar132 * local_918._0_4_ + auVar93._0_4_;
          fVar85 = fVar133 * local_918._4_4_ + auVar93._4_4_;
          fVar96 = fStack_c20 * local_918._8_4_ + auVar93._8_4_;
          fVar137 = fStack_c1c * local_918._12_4_ + auVar93._12_4_;
          auVar139 = rcpps(auVar93,auVar148);
          fVar70 = auVar139._0_4_;
          fVar82 = auVar139._4_4_;
          fVar173 = auVar139._8_4_;
          fVar179 = auVar139._12_4_;
          fVar71 = auVar86._0_4_;
          fVar81 = auVar86._4_4_;
          fVar150 = auVar86._12_4_;
          fVar108 = auVar86._8_4_;
          local_928._0_4_ =
               ((fVar71 - auVar148._0_4_ * fVar70) * fVar70 + fVar70) * (fVar84 + fVar84);
          local_928._4_4_ =
               ((fVar81 - auVar148._4_4_ * fVar82) * fVar82 + fVar82) * (fVar85 + fVar85);
          fStack_920 = ((fVar108 - auVar148._8_4_ * fVar173) * fVar173 + fVar173) *
                       (fVar96 + fVar96);
          fStack_91c = ((fVar150 - auVar148._12_4_ * fVar179) * fVar179 + fVar179) *
                       (fVar137 + fVar137);
          fVar70 = ray->tfar;
          fVar82 = (ray->org).field_0.m128[3];
          auVar104._0_4_ =
               -(uint)((float)local_928._0_4_ <= fVar70 && fVar82 <= (float)local_928._0_4_);
          auVar104._4_4_ =
               -(uint)((float)local_928._4_4_ <= fVar70 && fVar82 <= (float)local_928._4_4_);
          auVar104._8_4_ = -(uint)(fStack_920 <= fVar70 && fVar82 <= fStack_920);
          auVar104._12_4_ = -(uint)(fStack_91c <= fVar70 && fVar82 <= fStack_91c);
          auVar149._0_4_ = -(uint)(auVar148._0_4_ != 0.0) & auVar127._0_4_ & auVar104._0_4_;
          auVar149._4_4_ = -(uint)(auVar148._4_4_ != 0.0) & auVar127._4_4_ & auVar104._4_4_;
          auVar149._8_4_ = -(uint)(auVar148._8_4_ != 0.0) & auVar127._8_4_ & auVar104._8_4_;
          auVar149._12_4_ = -(uint)(auVar148._12_4_ != 0.0) & auVar127._12_4_ & auVar104._12_4_;
          uVar45 = movmskps(iVar51,auVar149);
          if (uVar45 != 0) {
            auVar43._4_4_ = fVar106;
            auVar43._0_4_ = fVar99;
            auVar43._8_4_ = fVar109;
            auVar43._12_4_ = fVar131;
            local_8e8 = local_8d8;
            auVar139 = rcpps(auVar104,auVar43);
            fVar70 = auVar139._0_4_;
            fVar82 = auVar139._4_4_;
            fVar173 = auVar139._8_4_;
            fVar179 = auVar139._12_4_;
            fVar70 = (float)(-(uint)(1e-18 <= ABS(fVar99)) &
                            (uint)((fVar71 - fVar99 * fVar70) * fVar70 + fVar70));
            fVar82 = (float)(-(uint)(1e-18 <= ABS(fVar106)) &
                            (uint)((fVar81 - fVar106 * fVar82) * fVar82 + fVar82));
            fVar173 = (float)(-(uint)(1e-18 <= ABS(fVar109)) &
                             (uint)((fVar108 - fVar109 * fVar173) * fVar173 + fVar173));
            fVar179 = (float)(-(uint)(1e-18 <= ABS(fVar131)) &
                             (uint)((fVar150 - fVar131 * fVar179) * fVar179 + fVar179));
            auVar128._0_4_ = fVar164 * fVar70;
            auVar128._4_4_ = fVar165 * fVar82;
            auVar128._8_4_ = fVar174 * fVar173;
            auVar128._12_4_ = fVar176 * fVar179;
            auVar139 = minps(auVar128,auVar86);
            auVar169._0_4_ = fVar70 * auVar161._0_4_;
            auVar169._4_4_ = fVar82 * auVar161._4_4_;
            auVar169._8_4_ = fVar173 * auVar161._8_4_;
            auVar169._12_4_ = fVar179 * auVar161._12_4_;
            auVar86 = minps(auVar169,auVar86);
            auVar94._0_4_ = fVar71 - auVar139._0_4_;
            auVar94._4_4_ = fVar81 - auVar139._4_4_;
            auVar94._8_4_ = fVar108 - auVar139._8_4_;
            auVar94._12_4_ = fVar150 - auVar139._12_4_;
            auVar105._0_4_ = fVar71 - auVar86._0_4_;
            auVar105._4_4_ = fVar81 - auVar86._4_4_;
            auVar105._8_4_ = fVar108 - auVar86._8_4_;
            auVar105._12_4_ = fVar150 - auVar86._12_4_;
            local_948 = blendvps(auVar139,auVar94,local_8d8);
            local_938 = blendvps(auVar86,auVar105,local_8d8);
            uVar65 = (ulong)(uVar45 & 0xff);
            auVar139 = local_b78;
            fVar108 = local_b88;
            fVar70 = fStack_b84;
            fVar71 = fStack_b80;
            fVar81 = fStack_b7c;
            fVar150 = local_be8;
            fVar84 = fStack_be4;
            fVar85 = fStack_be0;
            fVar96 = fStack_bdc;
            fVar137 = local_bf8;
            fVar97 = fStack_bf4;
            fVar98 = fStack_bf0;
            fVar99 = fStack_bec;
            fVar179 = local_b98;
            fVar100 = fStack_b94;
            fVar106 = fStack_b90;
            fVar107 = fStack_b8c;
            fVar153 = local_ba8;
            fVar109 = fStack_ba4;
            fVar115 = fStack_ba0;
            fVar116 = fStack_b9c;
            fVar82 = local_bb8;
            fVar117 = fStack_bb4;
            fVar121 = fStack_bb0;
            fVar123 = fStack_bac;
            fVar173 = local_bc8;
            fVar130 = fStack_bc4;
            fVar131 = fStack_bc0;
            fVar132 = fStack_bbc;
            fVar145 = local_bd8;
            fVar133 = fStack_bd4;
            fVar134 = fStack_bd0;
            fVar138 = fStack_bcc;
            fVar152 = local_c08;
            fVar158 = fStack_c04;
            fVar143 = fStack_c00;
            fVar144 = fStack_bfc;
            fStack_c54 = fStack_c50;
            do {
              uVar64 = 0;
              if (uVar65 != 0) {
                for (; (uVar65 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                }
              }
              h.geomID = *(uint *)(lVar58 + 0x40 + uVar64 * 4);
              pGVar28 = (pSVar55->geometries).items[h.geomID].ptr;
              if ((pGVar28->mask & ray->mask) == 0) {
                uVar65 = uVar65 ^ 1L << (uVar64 & 0x3f);
                bVar35 = true;
              }
              else {
                pRVar34 = context->args;
                if ((pRVar34->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar28->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar35 = false;
                }
                else {
                  h.u = *(float *)(local_948 + uVar64 * 4);
                  h.v = *(float *)(local_938 + uVar64 * 4);
                  args.context = context->user;
                  h.primID = *(uint *)(lVar58 + 0x50 + uVar64 * 4);
                  h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_918 + uVar64 * 4);
                  h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_908 + uVar64 * 4);
                  h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_8f8 + uVar64 * 4);
                  h.instID[0] = (args.context)->instID[0];
                  h.instPrimID[0] = (args.context)->instPrimID[0];
                  local_c58 = ray->tfar;
                  ray->tfar = *(float *)(local_928 + uVar64 * 4);
                  local_c5c = -1;
                  args.valid = &local_c5c;
                  args.geometryUserPtr = pGVar28->userPtr;
                  args.hit = (RTCHitN *)&h;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if ((pGVar28->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     (local_c28 = lVar58, (*pGVar28->occlusionFilterN)(&args), context = local_c40,
                     pSVar55 = local_b50, lVar58 = local_c28, auVar139 = local_b78,
                     fVar108 = local_b88, fVar70 = fStack_b84, fVar71 = fStack_b80,
                     fVar81 = fStack_b7c, fVar150 = local_be8, fVar84 = fStack_be4,
                     fVar85 = fStack_be0, fVar96 = fStack_bdc, fVar137 = local_bf8,
                     fVar97 = fStack_bf4, fVar98 = fStack_bf0, fVar99 = fStack_bec,
                     fVar179 = local_b98, fVar100 = fStack_b94, fVar106 = fStack_b90,
                     fVar107 = fStack_b8c, fVar153 = local_ba8, fVar109 = fStack_ba4,
                     fVar115 = fStack_ba0, fVar116 = fStack_b9c, fVar82 = local_bb8,
                     fVar117 = fStack_bb4, fVar121 = fStack_bb0, fVar123 = fStack_bac,
                     fVar173 = local_bc8, fVar130 = fStack_bc4, fVar131 = fStack_bc0,
                     fVar132 = fStack_bbc, fVar145 = local_bd8, fVar133 = fStack_bd4,
                     fVar134 = fStack_bd0, fVar138 = fStack_bcc, fVar152 = local_c08,
                     fVar158 = fStack_c04, fVar143 = fStack_c00, fVar144 = fStack_bfc,
                     *args.valid != 0)) {
                    if (pRVar34->filter != (RTCFilterFunctionN)0x0) {
                      if (((pRVar34->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar28->field_8).field_0x2 & 0x40) != 0)) {
                        (*pRVar34->filter)(&args);
                        context = local_c40;
                        auVar139 = local_b78;
                        fVar108 = local_b88;
                        fVar70 = fStack_b84;
                        fVar71 = fStack_b80;
                        fVar81 = fStack_b7c;
                        fVar150 = local_be8;
                        fVar84 = fStack_be4;
                        fVar85 = fStack_be0;
                        fVar96 = fStack_bdc;
                        fVar137 = local_bf8;
                        fVar97 = fStack_bf4;
                        fVar98 = fStack_bf0;
                        fVar99 = fStack_bec;
                        fVar179 = local_b98;
                        fVar100 = fStack_b94;
                        fVar106 = fStack_b90;
                        fVar107 = fStack_b8c;
                        fVar153 = local_ba8;
                        fVar109 = fStack_ba4;
                        fVar115 = fStack_ba0;
                        fVar116 = fStack_b9c;
                        fVar82 = local_bb8;
                        fVar117 = fStack_bb4;
                        fVar121 = fStack_bb0;
                        fVar123 = fStack_bac;
                        fVar173 = local_bc8;
                        fVar130 = fStack_bc4;
                        fVar131 = fStack_bc0;
                        fVar132 = fStack_bbc;
                        fVar145 = local_bd8;
                        fVar133 = fStack_bd4;
                        fVar134 = fStack_bd0;
                        fVar138 = fStack_bcc;
                        fVar152 = local_c08;
                        fVar158 = fStack_c04;
                        fVar143 = fStack_c00;
                        fVar144 = fStack_bfc;
                      }
                      if (*args.valid == 0) goto LAB_0022ec8c;
                    }
                    bVar35 = false;
                  }
                  else {
LAB_0022ec8c:
                    ray->tfar = local_c58;
                    uVar65 = uVar65 ^ 1L << (uVar64 & 0x3f);
                    bVar35 = true;
                  }
                }
              }
              if (!bVar35) goto LAB_0022ed69;
            } while (uVar65 != 0);
          }
        }
        uVar46 = uVar46 + 1;
        bVar69 = uVar46 < uVar52;
      } while (uVar46 != uVar52);
      iVar51 = 0;
      auVar139 = local_b78;
      fVar108 = local_b88;
      fVar70 = fStack_b84;
      fVar71 = fStack_b80;
      fVar81 = fStack_b7c;
      fVar150 = local_be8;
      fVar84 = fStack_be4;
      fVar85 = fStack_be0;
      fVar96 = fStack_bdc;
      fVar137 = local_bf8;
      fVar97 = fStack_bf4;
      fVar98 = fStack_bf0;
      fVar99 = fStack_bec;
      fVar179 = local_b98;
      fVar100 = fStack_b94;
      fVar106 = fStack_b90;
      fVar107 = fStack_b8c;
      fVar153 = local_ba8;
      fVar109 = fStack_ba4;
      fVar115 = fStack_ba0;
      fVar116 = fStack_b9c;
      fVar82 = local_bb8;
      fVar117 = fStack_bb4;
      fVar121 = fStack_bb0;
      fVar123 = fStack_bac;
      fVar173 = local_bc8;
      fVar130 = fStack_bc4;
      fVar131 = fStack_bc0;
      fVar132 = fStack_bbc;
      fVar145 = local_bd8;
      fVar133 = fStack_bd4;
      fVar134 = fStack_bd0;
      fVar138 = fStack_bcc;
      fVar143 = fStack_c00;
      fVar144 = fStack_bfc;
    }
  }
  goto LAB_0022edb1;
LAB_0022ed69:
  fStack_c04 = fVar158;
  local_c08 = fVar152;
  iVar51 = 0;
  if (bVar69) {
    ray->tfar = -INFINITY;
    iVar51 = 3;
  }
LAB_0022edb1:
  if (iVar51 == 3) {
    return;
  }
  goto LAB_0022d5b5;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }